

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

void __thiscall glu::StructType::addMember(StructType *this,char *name,VarType *type)

{
  StructMember local_58;
  VarType *local_20;
  VarType *type_local;
  char *name_local;
  StructType *this_local;
  
  local_20 = type;
  type_local = (VarType *)name;
  name_local = (char *)this;
  StructMember::StructMember(&local_58,name,type);
  std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>::push_back
            (&this->m_members,&local_58);
  StructMember::~StructMember(&local_58);
  return;
}

Assistant:

void StructType::addMember (const char* name, const VarType& type)
{
	m_members.push_back(StructMember(name, type));
}